

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::response::content_length(response *this,unsigned_long_long len)

{
  string *in_RDI;
  unsigned_long_long in_stack_00000138;
  response *this_00;
  string local_68 [55];
  undefined1 local_31 [49];
  
  this_00 = (response *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Content-Length",(allocator *)this_00);
  details::itoa<unsigned_long_long>(in_stack_00000138);
  set_header(this_00,in_RDI,(string *)0x39bb02);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

void response::content_length(unsigned long long len)
{
	set_header("Content-Length",itoa(len));
}